

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::truncate
          (ArrayBuilder<kj::Promise<void>_> *this,char *__file,__off_t __length)

{
  Promise<void> *pPVar1;
  int in_EAX;
  int extraout_EAX;
  Own<kj::_::PromiseNode> *this_00;
  
  pPVar1 = this->ptr;
  while (pPVar1 + (long)__file < this->pos) {
    this_00 = (Own<kj::_::PromiseNode> *)(this->pos + -1);
    this->pos = (RemoveConst<kj::Promise<void>_> *)this_00;
    Own<kj::_::PromiseNode>::dispose(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }